

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1502.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  CURL *pCVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  timeval tVar9;
  timeval older;
  timeval older_00;
  timeval older_01;
  CURLMcode ec_8;
  int ec_7;
  CURLMcode ec_6;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_e8;
  curl_slist *dns_cache_list;
  char redirect [160];
  int res;
  int still_running;
  CURLM *multi;
  CURL *dup;
  CURL *easy;
  char *URL_local;
  
  _res = 0;
  redirect[0x98] = '\0';
  redirect[0x99] = '\0';
  redirect[0x9a] = '\0';
  redirect[0x9b] = '\0';
  curl_msnprintf(&dns_cache_list,0xa0,"google.com:%s:%s",libtest_arg2,libtest_arg3);
  tVar9 = tutil_tvnow();
  _ec_1 = tVar9.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_e8 = tVar9.tv_usec;
  tv_test_start.tv_usec = local_e8;
  lVar3 = curl_slist_append(0,&dns_cache_list);
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  else {
    iVar2 = curl_global_init(3);
    uVar1 = _stderr;
    if (iVar2 != 0) {
      uVar4 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                    ,0x40,iVar2,uVar4);
      redirect._152_4_ = iVar2;
    }
    if (redirect._152_4_ == 0) {
      dup = (CURL *)curl_easy_init();
      if (dup == (CURL *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                      ,0x46);
        redirect[0x98] = '|';
        redirect[0x99] = '\0';
        redirect[0x9a] = '\0';
        redirect[0x9b] = '\0';
      }
      if (redirect._152_4_ == 0) {
        iVar2 = curl_easy_setopt(dup,0x2712,URL);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar4 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                        ,0x48,iVar2,uVar4);
          redirect._152_4_ = iVar2;
        }
        if (redirect._152_4_ == 0) {
          iVar2 = curl_easy_setopt(dup,0x2a,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar4 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                          ,0x49,iVar2,uVar4);
            redirect._152_4_ = iVar2;
          }
          if (redirect._152_4_ == 0) {
            iVar2 = curl_easy_setopt(dup,0x27db,lVar3);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar4 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                            ,0x4a,iVar2,uVar4);
              redirect._152_4_ = iVar2;
            }
            if (redirect._152_4_ == 0) {
              pCVar5 = (CURL *)curl_easy_duphandle(dup);
              if (pCVar5 == (CURL *)0x0) {
                curl_slist_free_all(lVar3);
                curl_easy_cleanup(dup);
                return 0x1b;
              }
              curl_easy_cleanup(dup);
              _res = curl_multi_init();
              if (_res == 0) {
                curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                              ,0x57);
                redirect[0x98] = '{';
                redirect[0x99] = '\0';
                redirect[0x9a] = '\0';
                redirect[0x9b] = '\0';
              }
              dup = pCVar5;
              if (redirect._152_4_ == 0) {
                iVar2 = curl_multi_add_handle(_res,pCVar5);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar4 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                ,0x59,iVar2,uVar4);
                  redirect._152_4_ = iVar2;
                }
                if (redirect._152_4_ == 0) {
                  iVar2 = curl_multi_perform(_res,redirect + 0x9c);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    if ((int)redirect._156_4_ < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                    ,0x5b,redirect._156_4_);
                      redirect[0x98] = 'z';
                      redirect[0x99] = '\0';
                      redirect[0x9a] = '\0';
                      redirect[0x9b] = '\0';
                    }
                  }
                  else {
                    uVar4 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                  ,0x5b,iVar2,uVar4);
                    redirect._152_4_ = iVar2;
                  }
                  if (redirect._152_4_ == 0) {
                    tVar9 = tutil_tvnow();
                    older.tv_usec = tv_test_start.tv_usec;
                    older.tv_sec = tv_test_start.tv_sec;
                    lVar6 = tutil_tvdiff(tVar9,older);
                    if (60000 < lVar6) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                    ,0x5d);
                      redirect[0x98] = '}';
                      redirect[0x99] = '\0';
                      redirect[0x9a] = '\0';
                      redirect[0x9b] = '\0';
                    }
                    while ((redirect._152_4_ == 0 && (redirect._156_4_ != 0))) {
                      __arr._4_4_ = -99;
                      for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
                        fdwrite.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
                      }
                      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                          __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                        fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                      }
                      for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10;
                          __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                        (&__i + (ulong)__arr_2._4_4_ * 2)[0] = 0;
                        (&__i + (ulong)__arr_2._4_4_ * 2)[1] = 0;
                      }
                      fdread.__fds_bits[0xf] = 1;
                      iVar2 = curl_multi_fdset(_res,fdwrite.__fds_bits + 0xf,
                                               fdexcep.__fds_bits + 0xf,&__i,(long)&__arr + 4);
                      uVar1 = _stderr;
                      if (iVar2 == 0) {
                        if (__arr._4_4_ < -1) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                        ,0x6c,__arr._4_4_);
                          redirect[0x98] = 'z';
                          redirect[0x99] = '\0';
                          redirect[0x9a] = '\0';
                          redirect[0x9b] = '\0';
                        }
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                      ,0x6c,iVar2,uVar4);
                        redirect._152_4_ = iVar2;
                      }
                      if (redirect._152_4_ != 0) break;
                      iVar2 = select_wrapper(__arr._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                             (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&__i,
                                             (timeval *)(fdread.__fds_bits + 0xf));
                      if (iVar2 == -1) {
                        piVar7 = __errno_location();
                        uVar1 = _stderr;
                        iVar2 = *piVar7;
                        pcVar8 = strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                      ,0x70,iVar2,pcVar8);
                        redirect[0x98] = 'y';
                        redirect[0x99] = '\0';
                        redirect[0x9a] = '\0';
                        redirect[0x9b] = '\0';
                      }
                      if (redirect._152_4_ != 0) break;
                      tVar9 = tutil_tvnow();
                      older_00.tv_usec = tv_test_start.tv_usec;
                      older_00.tv_sec = tv_test_start.tv_sec;
                      lVar6 = tutil_tvdiff(tVar9,older_00);
                      if (60000 < lVar6) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                      ,0x72);
                        redirect[0x98] = '}';
                        redirect[0x99] = '\0';
                        redirect[0x9a] = '\0';
                        redirect[0x9b] = '\0';
                      }
                      if (redirect._152_4_ != 0) break;
                      iVar2 = curl_multi_perform(_res,redirect + 0x9c);
                      uVar1 = _stderr;
                      if (iVar2 == 0) {
                        if ((int)redirect._156_4_ < 0) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                        ,0x74,redirect._156_4_);
                          redirect[0x98] = 'z';
                          redirect[0x99] = '\0';
                          redirect[0x9a] = '\0';
                          redirect[0x9b] = '\0';
                        }
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                      ,0x74,iVar2,uVar4);
                        redirect._152_4_ = iVar2;
                      }
                      if (redirect._152_4_ != 0) break;
                      tVar9 = tutil_tvnow();
                      older_01.tv_usec = tv_test_start.tv_usec;
                      older_01.tv_sec = tv_test_start.tv_sec;
                      lVar6 = tutil_tvdiff(tVar9,older_01);
                      if (60000 < lVar6) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1502.c"
                                      ,0x76);
                        redirect[0x98] = '}';
                        redirect[0x99] = '\0';
                        redirect[0x9a] = '\0';
                        redirect[0x9b] = '\0';
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      curl_multi_cleanup(_res);
      curl_easy_cleanup(dup);
      curl_global_cleanup();
      curl_slist_free_all(lVar3);
      URL_local._4_1_ = redirect[0x98];
      URL_local._5_1_ = redirect[0x99];
      URL_local._6_1_ = redirect[0x9a];
      URL_local._7_1_ = redirect[0x9b];
    }
    else {
      curl_slist_free_all(lVar3);
      URL_local._4_1_ = redirect[0x98];
      URL_local._5_1_ = redirect[0x99];
      URL_local._6_1_ = redirect[0x9a];
      URL_local._7_1_ = redirect[0x9b];
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURL *dup;
  CURLM *multi = NULL;
  int still_running;
  int res = 0;

  char redirect[160];

  /* DNS cache injection */
  struct curl_slist *dns_cache_list;

  msnprintf(redirect, sizeof(redirect), "google.com:%s:%s", libtest_arg2,
            libtest_arg3);

  start_test_timing();

  dns_cache_list = curl_slist_append(NULL, redirect);
  if(!dns_cache_list) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(dns_cache_list);
    return res;
  }

  easy_init(easy);

  easy_setopt(easy, CURLOPT_URL, URL);
  easy_setopt(easy, CURLOPT_HEADER, 1L);
  easy_setopt(easy, CURLOPT_RESOLVE, dns_cache_list);

  dup = curl_easy_duphandle(easy);
  if(dup) {
    curl_easy_cleanup(easy);
    easy = dup;
  }
  else {
    curl_slist_free_all(dns_cache_list);
    curl_easy_cleanup(easy);
    return CURLE_OUT_OF_MEMORY;
  }

  multi_init(multi);

  multi_add_handle(multi, easy);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB1502
  /* undocumented cleanup sequence - type UA */
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1503
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(multi, easy);
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1504
  /* undocumented cleanup sequence - type UB */
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

#ifdef LIB1505
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(multi, easy);
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

  curl_slist_free_all(dns_cache_list);

  return res;
}